

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

string * __thiscall
chaiscript::exception::eval_error::pretty_print_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this)

{
  pointer psVar1;
  char *pcVar2;
  ostream *poVar3;
  shared_ptr<const_chaiscript::AST_Node> *t;
  shared_ptr<const_chaiscript::AST_Node> *t_00;
  shared_ptr<const_chaiscript::AST_Node> *t_01;
  size_t j;
  ulong uVar4;
  long lVar5;
  string local_1e8;
  string local_1c8 [32];
  ostringstream ss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  pcVar2 = (char *)(**(code **)(*(long *)this + 0x10))(this);
  std::operator<<((ostream *)&ss,pcVar2);
  if ((this->call_stack).
      super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->call_stack).
      super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    poVar3 = std::operator<<((ostream *)&ss,"during evaluation at (");
    poVar3 = std::operator<<(poVar3,*(string **)
                                     &((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)((long)&((((this->call_stack).
                                                                                                          
                                                  super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr)->location + 0x10))->
                                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            );
    poVar3 = std::operator<<(poVar3," ");
    startpos<std::shared_ptr<chaiscript::AST_Node_const>>
              (&local_1e8,
               (eval_error *)
               (this->call_stack).
               super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start,t);
    poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
    std::operator<<(poVar3,")\n");
    std::__cxx11::string::~string((string *)&local_1e8);
    poVar3 = std::operator<<((ostream *)&ss,'\n');
    poVar3 = std::operator<<(poVar3,(string *)&this->detail);
    std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<((ostream *)&ss,"  ");
    poVar3 = std::operator<<(poVar3,*(string **)
                                     &((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)((long)&((((this->call_stack).
                                                                                                          
                                                  super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr)->location + 0x10))->
                                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            );
    poVar3 = std::operator<<(poVar3," (");
    startpos<std::shared_ptr<chaiscript::AST_Node_const>>
              (&local_1e8,
               (eval_error *)
               (this->call_stack).
               super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start,t_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
    poVar3 = std::operator<<(poVar3,") \'");
    (**((((this->call_stack).
          super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super___shared_ptr<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       _vptr_AST_Node)(local_1c8);
    poVar3 = std::operator<<(poVar3,local_1c8);
    std::operator<<(poVar3,"\'");
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    lVar5 = 0x10;
    for (uVar4 = 1;
        psVar1 = (this->call_stack).
                 super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(this->call_stack).
                              super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4);
        uVar4 = uVar4 + 1) {
      if ((*(uint *)(*(long *)((long)&(psVar1->
                                      super___shared_ptr<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr + lVar5) + 0x18) | 8) != 0x1f) {
        std::operator<<((ostream *)&ss,'\n');
        poVar3 = std::operator<<((ostream *)&ss,"  from ");
        poVar3 = std::operator<<(poVar3,*(string **)
                                         (*(long *)((long)&(((this->call_stack).
                                                                                                                          
                                                  super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + lVar5) + 0x50));
        poVar3 = std::operator<<(poVar3," (");
        startpos<std::shared_ptr<chaiscript::AST_Node_const>>
                  (&local_1e8,
                   (eval_error *)
                   ((long)&(((this->call_stack).
                             super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + lVar5),t_01);
        poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
        poVar3 = std::operator<<(poVar3,") \'");
        (**(code **)**(undefined8 **)
                      ((long)&(((this->call_stack).
                                super__Vector_base<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super___shared_ptr<const_chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr + lVar5))(local_1c8);
        poVar3 = std::operator<<(poVar3,local_1c8);
        std::operator<<(poVar3,"\'");
        std::__cxx11::string::~string(local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      lVar5 = lVar5 + 0x10;
    }
  }
  std::operator<<((ostream *)&ss,'\n');
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string pretty_print() const
      {
        std::ostringstream ss;

        ss << what();
        if (call_stack.size() > 0) {
          ss << "during evaluation at (" << fname(call_stack[0]) << " " << startpos(call_stack[0]) << ")\n";
          ss << '\n' << detail << '\n';
          ss << "  " << fname(call_stack[0]) << " (" << startpos(call_stack[0]) << ") '" << pretty(call_stack[0]) << "'";
          for (size_t j = 1; j < call_stack.size(); ++j) {
            if (id(call_stack[j]) != chaiscript::AST_Node_Type::Block
                && id(call_stack[j]) != chaiscript::AST_Node_Type::File)
            {
              ss << '\n';
              ss << "  from " << fname(call_stack[j]) << " (" << startpos(call_stack[j]) << ") '" << pretty(call_stack[j]) << "'";
            }
          }
        }
        ss << '\n';
        return ss.str();
      }